

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateMemberCopyConstructor
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
  if (((!bVar2) && (bVar2 = EmptyDefault(this), !bVar2)) &&
     (bVar2 = use_micro_string(this), pPVar1 = local_18, !bVar2)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"$name$_(arena, from.$name$_, $default_variable_name$)");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
    return;
  }
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"$name$_(arena, from.$name$_)");
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  return;
}

Assistant:

void GenerateMemberCopyConstructor(io::Printer* p) const override {
    if (is_inlined() || EmptyDefault() || use_micro_string()) {
      p->Emit("$name$_(arena, from.$name$_)");
    } else {
      p->Emit("$name$_(arena, from.$name$_, $default_variable_name$)");
    }
  }